

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  int iVar1;
  undefined4 local_38 [2];
  size_t dlen;
  int rc;
  uint src_len_local;
  char *src_local;
  uint *datalen_local;
  char **data_local;
  LIBSSH2_SESSION *session_local;
  
  dlen._4_4_ = src_len;
  _rc = src;
  src_local = (char *)datalen;
  datalen_local = (uint *)data;
  data_local = (char **)session;
  iVar1 = _libssh2_base64_decode(session,data,(size_t *)local_38,src,(ulong)src_len);
  if (src_local != (char *)0x0) {
    *(undefined4 *)src_local = local_38[0];
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_base64_decode(LIBSSH2_SESSION *session, char **data,
                      unsigned int *datalen, const char *src,
                      unsigned int src_len)
{
    int rc;
    size_t dlen;

    rc = _libssh2_base64_decode(session, data, &dlen, src, src_len);

    if(datalen)
        *datalen = (unsigned int)dlen;

    return rc;
}